

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void __thiscall
libtest::printer::cprintln<std::__cxx11::string>
          (printer *this,ansi_sgr *command,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostream *poVar1;
  string sStack_68;
  ansi_sgr local_48;
  string local_40;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_40,command);
  std::operator<<(poVar1,(string *)&local_40);
  println<std::__cxx11::string>(this,args);
  poVar1 = this->os;
  local_48.m_color = white;
  local_48.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&sStack_68,&local_48);
  std::operator<<(poVar1,(string *)&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cprintln(const ansi_sgr& command, Args... args) { os << command.to_string(), println(args...), os << ansi_sgr{}.to_string(); }